

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::Psbt::GetTxInIndex(Psbt *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  OutPoint *in_RSI;
  long in_RDI;
  Txid local_30;
  OutPoint *local_10;
  
  local_10 = in_RSI;
  core::OutPoint::GetTxid(&local_30,in_RSI);
  uVar1 = core::OutPoint::GetVout(local_10);
  uVar1 = core::Transaction::GetTxInIndex((Transaction *)(in_RDI + 0x10),&local_30,uVar1);
  core::Txid::~Txid((Txid *)0x51d31e);
  return uVar1;
}

Assistant:

uint32_t Psbt::GetTxInIndex(const OutPoint& outpoint) const {
  return base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}